

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

QString * __thiscall QString::right(QString *__return_storage_ptr__,QString *this,qsizetype n)

{
  ulong uVar1;
  Data *pDVar2;
  
  uVar1 = (this->d).size;
  if (uVar1 < (ulong)n || uVar1 - n == 0) {
    pDVar2 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = uVar1;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    ::QString::QString(__return_storage_ptr__,(QChar *)((this->d).ptr + (uVar1 - n)),n);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] QString right(qsizetype n) const &
    {
        if (size_t(n) >= size_t(size()))
            return *this;
        return last(n);
    }